

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O0

void __thiscall trackerboy::apu::NoiseChannel::fastforward(NoiseChannel *this,uint32_t cycles)

{
  Timer *this_00;
  uint32_t local_18;
  uint32_t clocks;
  uint32_t cycles_local;
  NoiseChannel *this_local;
  
  this_00 = Channel::timer(&this->super_Channel);
  local_18 = Timer::fastforward(this_00,cycles);
  if ((this->mValidScf & 1U) != 0) {
    for (; local_18 != 0; local_18 = local_18 - 1) {
      clockLfsr(this);
    }
    updateOutput(this);
  }
  return;
}

Assistant:

void NoiseChannel::fastforward(uint32_t cycles) noexcept {

    auto clocks = timer().fastforward(cycles);
    if (mValidScf) {
        while (clocks) {
            clockLfsr();
            --clocks;
        }
        updateOutput();
    }
}